

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::CBStringList::split(CBStringList *this,CBStream *b,uchar splitChar)

{
  int iVar1;
  CBStringException *this_00;
  CBString *local_a0;
  allocator local_91;
  string local_90;
  undefined1 local_70 [8];
  CBStringException bstr__cppwrapper_exception;
  undefined1 local_38 [8];
  CBString sc;
  uchar splitChar_local;
  CBStream *b_local;
  CBStringList *this_local;
  
  sc.super_tagbstring.data._7_1_ = splitChar;
  CBString::CBString((CBString *)local_38,splitChar);
  local_a0 = (CBString *)0x0;
  if (&stack0x00000000 != (undefined1 *)0x38) {
    local_a0 = &sc;
  }
  iVar1 = bssplitscb(b->m_s,(const_bstring)local_a0,streamSplitCb,this);
  if (iVar1 < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,"CBString::Split bstream failure",&local_91);
    CBStringException::CBStringException((CBStringException *)local_70,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,(CBStringException *)local_70);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  CBString::~CBString((CBString *)local_38);
  return;
}

Assistant:

void CBStringList::split (const CBStream& b, unsigned char splitChar) {
CBString sc (splitChar);
	if (0 > bssplitscb (b.m_s, (bstring) &sc,
	                    streamSplitCb, (void *) this)) {
		bstringThrow ("Split bstream failure");
	}
}